

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

void __thiscall lsim::Simulator::release_node(Simulator *this,node_t node_id)

{
  value_type_conflict4 local_4;
  
  if ((ulong)node_id <
      (ulong)((long)(this->m_node_values_read).
                    super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_node_values_read).
                    super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_free_nodes,&local_4);
    return;
  }
  __assert_fail("node_id < m_node_values_read.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xa7,"void lsim::Simulator::release_node(node_t)");
}

Assistant:

void Simulator::release_node(node_t node_id) {
    assert(node_id < m_node_values_read.size());
    m_free_nodes.push_back(node_id);
}